

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O0

void TestEncoderVelocity(BasePort *port,AmpIO *board,MotionTrajectory *motion)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  ostream *poVar5;
  void *pvVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  double dt_00;
  double dVar10;
  double local_1398;
  double raccel;
  double rvel;
  double rpos;
  ofstream outFile;
  double local_1180;
  double tOffset;
  double timeDiff;
  uint local_1168;
  uint curDiff;
  uint lastDiff;
  int testPos;
  size_t testIndex;
  double rtime;
  size_t dataIndex;
  double dStack_1140;
  uint numDiff;
  double sumDiff;
  size_t curIndex;
  double dStack_1128;
  int epos;
  double clkTime;
  undefined1 local_1118 [7];
  bool waveform_active;
  EncData encData;
  size_t dataSize;
  double local_1098;
  double af;
  double vf;
  double pf;
  double tf;
  double loopTime;
  vector<EncData,_std::allocator<EncData>_> measuredData;
  int startPos;
  uint i;
  double accel;
  double vel;
  double pos;
  uint numEntries;
  double dt;
  quadlet_t waveform [1024];
  int testAxis;
  int WLEN;
  MotionTrajectory *motion_local;
  AmpIO *board_local;
  BasePort *port_local;
  
  waveform[0x3ff] = 0x400;
  waveform[0x3fe] = 0;
  (*(board->super_FpgaIO).super_BoardIO._vptr_BoardIO[10])();
  pos._4_4_ = MotionTrajectory::CreateWaveform(motion,(quadlet_t *)&dt,0x400,dt_00,1,1);
  poVar5 = std::operator<<((ostream *)&std::cout,"Writing waveform table with ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pos._4_4_);
  poVar5 = std::operator<<(poVar5," entries");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  bVar1 = AmpIO::WriteWaveformTable(board,(quadlet_t *)&dt,0,(unsigned_short)pos._4_4_);
  if (bVar1) {
    bVar1 = MotionTrajectory::GetValuesAtTime(motion,0.0,&vel,&accel,(double *)&startPos);
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Initializing encoders (about 6 seconds)");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      if (accel < 0.0) {
        AmpIO::WriteDigitalOutput(board,'\x03','\0');
        Amp1394_Sleep(1.4);
        AmpIO::WriteDigitalOutput(board,'\x03','\x02');
        Amp1394_Sleep(1.4);
        AmpIO::WriteDigitalOutput(board,'\x03','\x03');
        Amp1394_Sleep(1.4);
        AmpIO::WriteDigitalOutput(board,'\x03','\x01');
        Amp1394_Sleep(1.4);
      }
      else {
        AmpIO::WriteDigitalOutput(board,'\x03','\x02');
        Amp1394_Sleep(1.4);
        AmpIO::WriteDigitalOutput(board,'\x03','\0');
        Amp1394_Sleep(1.4);
        AmpIO::WriteDigitalOutput(board,'\x03','\x01');
        Amp1394_Sleep(1.4);
        AmpIO::WriteDigitalOutput(board,'\x03','\x03');
        Amp1394_Sleep(1.4);
      }
      for (measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
          measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        AmpIO::WriteEncoderPreload
                  (board,measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,0);
      }
      Amp1394_Sleep(0.05);
      (*port->_vptr_BasePort[0x1d])();
      measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = AmpIO::GetEncoderPosition(board,0);
      for (measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 5 &&
          (int32_t)measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage != 0;
          measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        poVar5 = std::operator<<((ostream *)&std::cout,"WriteEncoderPreload: retrying (pos = ");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,(int32_t)measuredData.
                                            super__Vector_base<EncData,_std::allocator<EncData>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar5 = std::operator<<(poVar5,")");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        AmpIO::WriteEncoderPreload(board,0,0);
        Amp1394_Sleep(0.05);
        (*port->_vptr_BasePort[0x1d])();
        measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = AmpIO::GetEncoderPosition(board,0);
      }
      if ((int32_t)measuredData.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Starting position = ");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,(int32_t)measuredData.
                                            super__Vector_base<EncData,_std::allocator<EncData>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar5 = std::operator<<(poVar5,", velocity = ");
        dVar10 = AmpIO::GetEncoderVelocity(board,0);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar10);
        poVar5 = std::operator<<(poVar5,", acceleration = ");
        dVar10 = AmpIO::GetEncoderAcceleration(board,0,1.0);
        pvVar6 = (void *)std::ostream::operator<<(poVar5,dVar10);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)&std::cout,"Running test");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::vector<EncData,_std::allocator<EncData>_>::vector
                  ((vector<EncData,_std::allocator<EncData>_> *)&loopTime);
        tf = 0.0005;
        MotionTrajectory::GetFinalValues(motion,&pf,&vf,&af,&local_1098);
        uVar7 = (ulong)(pf / 0.0005);
        encData.encVelData.super_EncoderVelocity._48_8_ =
             uVar7 | (long)(pf / 0.0005 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f;
        std::vector<EncData,_std::allocator<EncData>_>::reserve
                  ((vector<EncData,_std::allocator<EncData>_> *)&loopTime,
                   encData.encVelData.super_EncoderVelocity._48_8_);
        EncData::EncData((EncData *)local_1118);
        local_1118._0_4_ = 0;
        bVar1 = true;
        AmpIO::WriteWaveformControl(board,'\x03','\x03');
        while (bVar1 || local_1118._0_4_ == 0) {
          (*port->_vptr_BasePort[0x1d])();
          uVar4 = AmpIO::GetDigitalInput(board);
          bVar1 = (uVar4 & 0x20000000) != 0;
          if (bVar1) {
            local_1118._0_4_ = AmpIO::GetEncoderPosition(board,0);
            encData._0_8_ = AmpIO::GetEncoderVelocity(board,0);
            encData.mvel = AmpIO::GetEncoderVelocityPredicted(board,0,1.0);
            encData.mvelpred = AmpIO::GetEncoderAcceleration(board,0,1.0);
            encData.maccel = AmpIO::GetEncoderRunningCounterSeconds(board,0);
            encData.run = AmpIO::GetTimestampSeconds(board);
            bVar2 = AmpIO::GetEncoderVelocityData(board,0,(EncoderVelocity *)&encData.ts);
            if (!bVar2) {
              poVar5 = std::operator<<((ostream *)&std::cout,"GetEncoderVelocityData failed");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            std::vector<EncData,_std::allocator<EncData>_>::push_back
                      ((vector<EncData,_std::allocator<EncData>_> *)&loopTime,
                       (value_type *)local_1118);
          }
          Amp1394_Sleep(0.0005);
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"Read ");
        sVar8 = std::vector<EncData,_std::allocator<EncData>_>::size
                          ((vector<EncData,_std::allocator<EncData>_> *)&loopTime);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
        poVar5 = std::operator<<(poVar5," samples");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        dStack_1128 = 0.0;
        curIndex._4_4_ = MotionTrajectory::GetEncoderEventPosition(motion,0);
        sumDiff = 4.94065645841247e-324;
        dStack_1140 = 0.0;
        dataIndex._4_4_ = 0;
        for (rtime = 0.0;
            dVar10 = (double)std::vector<EncData,_std::allocator<EncData>_>::size
                                       ((vector<EncData,_std::allocator<EncData>_> *)&loopTime),
            (ulong)rtime < (ulong)dVar10; rtime = (double)((long)rtime + 1)) {
          pvVar9 = std::vector<EncData,_std::allocator<EncData>_>::operator[]
                             ((vector<EncData,_std::allocator<EncData>_> *)&loopTime,
                              (size_type)rtime);
          memcpy(local_1118,pvVar9,0x68);
          dStack_1128 = encData.run + dStack_1128;
          if (local_1118._0_4_ != curIndex._4_4_) {
            testIndex = 0;
            iVar3 = MotionTrajectory::GetEncoderEventPosition(motion,(size_t)sumDiff);
            if (local_1118._0_4_ == iVar3) {
              testIndex = (size_t)MotionTrajectory::GetEncoderEventTime(motion,(size_t)sumDiff);
              sumDiff = (double)((long)sumDiff + 1);
            }
            else {
              poVar5 = std::operator<<((ostream *)&std::cout,"Unexpected encoder position: ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1118._0_4_);
              poVar5 = std::operator<<(poVar5,", expecting ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
              poVar5 = std::operator<<(poVar5," (index = ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)sumDiff);
              poVar5 = std::operator<<(poVar5,")");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              timeDiff._4_4_ = iVar3 - local_1118._0_4_;
              if ((int)timeDiff._4_4_ < 1) {
                timeDiff._4_4_ = -timeDiff._4_4_;
              }
              _lastDiff = sumDiff;
              local_1168 = timeDiff._4_4_;
              while( true ) {
                dVar10 = (double)MotionTrajectory::GetNumEncoderEvents(motion);
                bVar1 = false;
                if (((ulong)_lastDiff < (ulong)dVar10) && (bVar1 = false, timeDiff._4_4_ != 0)) {
                  bVar1 = timeDiff._4_4_ <= local_1168;
                }
                if (!bVar1) break;
                iVar3 = MotionTrajectory::GetEncoderEventPosition(motion,(size_t)_lastDiff);
                local_1168 = timeDiff._4_4_;
                timeDiff._4_4_ = iVar3 - local_1118._0_4_;
                if ((int)timeDiff._4_4_ < 1) {
                  timeDiff._4_4_ = -timeDiff._4_4_;
                }
                if (timeDiff._4_4_ == 0) {
                  poVar5 = std::operator<<((ostream *)&std::cout,"Found match at index ");
                  pvVar6 = (void *)std::ostream::operator<<(poVar5,(ulong)_lastDiff);
                  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
                  testIndex = (size_t)MotionTrajectory::GetEncoderEventTime
                                                (motion,(size_t)_lastDiff);
                  sumDiff = (double)((long)_lastDiff + 1);
                }
                _lastDiff = (double)((long)_lastDiff + 1);
              }
            }
            if (((0.0 < (double)testIndex) &&
                (bVar1 = EncoderVelocity::IsRunningCounterOverflow((EncoderVelocity *)&encData.ts),
                !bVar1)) && ((ulong)sumDiff < 10)) {
              dStack_1140 = (dStack_1128 - ((double)testIndex + encData.maccel)) + dStack_1140;
              dataIndex._4_4_ = dataIndex._4_4_ + 1;
            }
            curIndex._4_4_ = local_1118._0_4_;
          }
        }
        local_1180 = 0.0;
        if (dataIndex._4_4_ != 0) {
          local_1180 = dStack_1140 / (double)dataIndex._4_4_;
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"Time offset = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1180);
        poVar5 = std::operator<<(poVar5," (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,dataIndex._4_4_);
        poVar5 = std::operator<<(poVar5," samples)");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::ofstream::ofstream(&rpos,"waveform.csv",_S_trunc);
        poVar5 = std::operator<<((ostream *)&rpos,
                                 "time, mpos, mvel, mvelpred, maccel, run, rpos, rvel, raccel, ts, velper, qtr1, qtr5, flags"
                                );
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        dStack_1128 = -local_1180;
        for (rtime = 0.0;
            dVar10 = (double)std::vector<EncData,_std::allocator<EncData>_>::size
                                       ((vector<EncData,_std::allocator<EncData>_> *)&loopTime),
            (ulong)rtime < (ulong)dVar10; rtime = (double)((long)rtime + 1)) {
          pvVar9 = std::vector<EncData,_std::allocator<EncData>_>::operator[]
                             ((vector<EncData,_std::allocator<EncData>_> *)&loopTime,
                              (size_type)rtime);
          memcpy(local_1118,pvVar9,0x68);
          dStack_1128 = encData.run + dStack_1128;
          bVar1 = MotionTrajectory::GetValuesAtTime(motion,dStack_1128,&rvel,&raccel,&local_1398);
          if (bVar1) {
            poVar5 = (ostream *)std::ostream::operator<<(&rpos,dStack_1128);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1118._0_4_);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)encData._0_8_);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,encData.mvel);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,encData.mvelpred);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,encData.maccel);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,rvel);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,raccel);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1398);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,encData.run);
            poVar5 = std::operator<<(poVar5,", ");
            uVar4 = EncoderVelocity::GetEncoderVelocityPeriod((EncoderVelocity *)&encData.ts);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
            poVar5 = std::operator<<(poVar5,", ");
            uVar4 = EncoderVelocity::GetEncoderQuarter1Period((EncoderVelocity *)&encData.ts);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
            poVar5 = std::operator<<(poVar5,", ");
            uVar4 = EncoderVelocity::GetEncoderQuarter5Period((EncoderVelocity *)&encData.ts);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
            std::operator<<(poVar5,", ");
            EncoderVelocityLocal::PrintFlags((EncoderVelocityLocal *)&encData.ts,(ofstream *)&rpos);
            std::ostream::operator<<(&rpos,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar5 = std::operator<<((ostream *)&std::cout,"GetValuesAtTime failed for time = ");
            pvVar6 = (void *)std::ostream::operator<<(poVar5,dStack_1128);
            std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          }
        }
        std::ofstream::~ofstream(&rpos);
        EncData::~EncData((EncData *)local_1118);
        std::vector<EncData,_std::allocator<EncData>_>::~vector
                  ((vector<EncData,_std::allocator<EncData>_> *)&loopTime);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"Failed to preload encoder");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "TestEncoderVelocity: failed to get initial values");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"WriteWaveformTable failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void TestEncoderVelocity(BasePort *port, AmpIO *board, MotionTrajectory &motion)
{
    const int WLEN = 1024;
    const int testAxis = 0;   // All axes should be the same when using test board
    quadlet_t waveform[WLEN];
    double dt = board->GetFPGAClockPeriod();

    unsigned int numEntries = motion.CreateWaveform(waveform, WLEN, dt);

    std::cout << "Writing waveform table with " << numEntries << " entries" << std::endl;
    if (!board->WriteWaveformTable(waveform, 0, numEntries)) {
        std::cout << "WriteWaveformTable failed" << std::endl;
        return;
    }

    double pos, vel, accel;
    if (!motion.GetValuesAtTime(0.0, pos, vel, accel)) {
        std::cout << "TestEncoderVelocity: failed to get initial values" << std::endl;
        return;
    }
    std::cout << "Initializing encoders (about 6 seconds)" << std::endl;
    // Initial movements to initialize firmware
    // Wait long enough for encoder period to overflow
    if (vel >= 0) {
        board->WriteDigitalOutput(0x03, 0x02);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x00);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x01);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x03);
        Amp1394_Sleep(1.4);
    }
    else {
        board->WriteDigitalOutput(0x03, 0x00);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x02);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x03);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x01);
        Amp1394_Sleep(1.4);
    }

    // Initialize encoder position
    unsigned int i;
    for (i = 0; i < 4; i++)
        board->WriteEncoderPreload(i, 0);

    Amp1394_Sleep(0.05);
    port->ReadAllBoards();
    int startPos = board->GetEncoderPosition(testAxis);
    // Sometimes, position is non-zero after preload
    for (i = 0; (i < 5) && (startPos != 0); i++) {
        std::cout << "WriteEncoderPreload: retrying (pos = " << startPos << ")" << std::endl;
        board->WriteEncoderPreload(testAxis, 0);
        Amp1394_Sleep(0.05);
        port->ReadAllBoards();
        startPos = board->GetEncoderPosition(testAxis);
    }
    if (startPos != 0) {
        std::cout << "Failed to preload encoder" << std::endl;
        return;
    }
    std::cout << "Starting position = " << startPos
              << ", velocity = " << board->GetEncoderVelocity(testAxis)
              << ", acceleration = " << board->GetEncoderAcceleration(testAxis) << std::endl;
    std::cout << "Running test" << std::endl;

    std::vector<EncData> measuredData;
    // Estimate data size
    const double loopTime = 0.0005;  // Loop time in seconds (~2 kHz)
    double tf, pf, vf, af;
    motion.GetFinalValues(tf, pf, vf, af);
    // Overestimates datasize because the actual loop time will be less than loopTime.
    size_t dataSize = static_cast<size_t>(tf/loopTime);
    measuredData.reserve(dataSize);

    EncData encData;
    encData.mpos = 0;
    bool waveform_active = true;

    // Start waveform on DOUT1 and DOUT2 (to produce EncA and EncB using test board)
    board->WriteWaveformControl(0x03, 0x03);

    // Collect the data, storing it in measuredData
    while (waveform_active || (encData.mpos == 0)) {
        port->ReadAllBoards();
        waveform_active = board->GetDigitalInput()&0x20000000;
        if (waveform_active) {
            encData.mpos = board->GetEncoderPosition(testAxis);
            encData.mvel = board->GetEncoderVelocity(testAxis);
            encData.mvelpred = board->GetEncoderVelocityPredicted(testAxis);
            encData.maccel = board->GetEncoderAcceleration(testAxis);
            encData.run = board->GetEncoderRunningCounterSeconds(testAxis);
            encData.ts = board->GetTimestampSeconds();
            if (!board->GetEncoderVelocityData(testAxis, encData.encVelData))
                std::cout << "GetEncoderVelocityData failed" << std::endl;
            measuredData.push_back(encData);
        }
        Amp1394_Sleep(loopTime);
    }
    std::cout << "Read " << measuredData.size() << " samples" << std::endl;

    // Synchronize time
    // Time as measured by FPGA (accumulated timestamp values)
    double clkTime = 0.0;

    // Reference encoder position
    int epos = motion.GetEncoderEventPosition(0);
    size_t curIndex = 1;

    // For computing mean time difference
    double sumDiff = 0.0;
    unsigned int numDiff = 0;

    size_t dataIndex;
    for (dataIndex = 0; dataIndex < measuredData.size(); dataIndex++) {
        encData = measuredData[dataIndex];
        clkTime += encData.ts;
        // Find mpos in encoder list
        if (encData.mpos != epos) {
            double rtime = 0.0;
            epos = motion.GetEncoderEventPosition(curIndex);
            if (encData.mpos == epos) {
                rtime = motion.GetEncoderEventTime(curIndex);
                curIndex++;
            }
            else {
                std::cout << "Unexpected encoder position: " << encData.mpos << ", expecting " << epos
                          << " (index = " << curIndex << ")" << std::endl;
                size_t testIndex;
                int testPos = epos;
                unsigned int lastDiff = abs(epos-encData.mpos);
                unsigned int curDiff = lastDiff;
                for (testIndex = curIndex; (testIndex < motion.GetNumEncoderEvents()) && (curDiff != 0)
                         && (curDiff <= lastDiff) ; testIndex++) {
                    testPos = motion.GetEncoderEventPosition(testIndex);
                    lastDiff = curDiff;
                    curDiff = abs(testPos-encData.mpos);
                    if (curDiff == 0) {
                        std::cout << "Found match at index " << testIndex << std::endl;
                        rtime = motion.GetEncoderEventTime(testIndex);
                        curIndex = testIndex+1;
                    }
                }
                epos = encData.mpos;
            }
            // For now, consider first few encoder transitions when computing time difference
            if ((rtime > 0.0) && (!encData.encVelData.IsRunningCounterOverflow()) && (curIndex < 10)) {
                double timeDiff = clkTime-(rtime+encData.run);
                sumDiff += timeDiff;
                numDiff++;
            }
            epos = encData.mpos;
        }
    }
    double tOffset = 0.0;
    if (numDiff > 0)
        tOffset = sumDiff/numDiff;
    std::cout << "Time offset = " << tOffset << " (" << numDiff << " samples)" << std::endl;

    // Output data to file
    std::ofstream outFile("waveform.csv", std::ios_base::trunc);
    outFile << "time, mpos, mvel, mvelpred, maccel, run, rpos, rvel, raccel, ts, velper, qtr1, qtr5, flags" << std::endl;

    clkTime = -tOffset;
    for (dataIndex = 0; dataIndex < measuredData.size(); dataIndex++) {
        encData = measuredData[dataIndex];
        clkTime += encData.ts;
        double rpos, rvel, raccel;
        if (motion.GetValuesAtTime(clkTime, rpos, rvel, raccel)) {
            outFile << clkTime << ", " << encData.mpos << ", " << encData.mvel << ", " << encData.mvelpred << ", " << encData.maccel << ", "
                    << encData.run << ", " << rpos << ", " << rvel << ", " << raccel << ", " << encData.ts << ", "
                    << encData.encVelData.GetEncoderVelocityPeriod() << ", "
                    << encData.encVelData.GetEncoderQuarter1Period() << ", "
                    << encData.encVelData.GetEncoderQuarter5Period() << ", ";
            encData.encVelData.PrintFlags(outFile);
            outFile << std::endl;
        }
        else
            std::cout << "GetValuesAtTime failed for time = " << clkTime << std::endl;
    }
}